

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  ushort uVar1;
  int iVar2;
  Contrib_List *p;
  Contrib_List *pCVar3;
  uint uVar4;
  Contrib_List *pCVar5;
  int iVar6;
  Contrib *pCVar7;
  ulong uVar8;
  int iVar9;
  undefined8 *puVar10;
  Contrib_List *pCVar11;
  Contrib_List *pCVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Resample_Real RVar17;
  float fVar18;
  float fVar19;
  float local_94;
  float local_68;
  Contrib *local_40;
  
  p = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (p == (Contrib_List *)0x0) {
    return (Contrib_List *)0x0;
  }
  pCVar3 = (Contrib_List *)crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
  pCVar5 = p;
  pCVar12 = (Contrib_List *)0x0;
  if (pCVar3 == (Contrib_List *)0x0) goto LAB_00150a08;
  fVar18 = 1.0 / filter_scale;
  fVar19 = (float)dst_x / (float)src_x;
  pCVar5 = pCVar3;
  pCVar12 = p;
  if (1.0 <= fVar19) {
    if (0 < dst_x) {
      puVar10 = (undefined8 *)&pCVar3->field_0x4;
      uVar8 = 0;
      iVar6 = 0;
      do {
        fVar13 = ((float)(int)uVar8 + 0.5) / fVar19 + -0.5 + src_ofs;
        fVar14 = floorf(fVar13 - filter_support * filter_scale);
        fVar15 = ceilf(filter_support * filter_scale + fVar13);
        *(float *)((long)puVar10 + -4) = fVar13;
        *puVar10 = CONCAT44((int)fVar15,(int)fVar14);
        iVar6 = (iVar6 - (int)fVar14) + (int)fVar15 + 1;
        uVar8 = uVar8 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while ((uint)dst_x != uVar8);
      if ((iVar6 != 0) &&
         (local_40 = (Contrib *)crnlib_calloc((long)iVar6,8,(size_t *)0x0),
         local_40 != (Contrib *)0x0)) {
        if (0 < dst_x) {
          uVar8 = 0;
          pCVar7 = local_40;
          do {
            fVar19 = *(float *)(&pCVar3->n + uVar8 * 6);
            iVar6 = *(int *)(&pCVar3->field_0x4 + uVar8 * 0xc);
            iVar2 = *(int *)((long)&pCVar3->p + uVar8 * 0xc);
            p[uVar8].n = 0;
            p[uVar8].p = pCVar7;
            if (iVar2 < iVar6) goto LAB_001509f1;
            pCVar11 = p + uVar8;
            pCVar7 = pCVar7 + ((iVar2 - iVar6) + 1);
            fVar13 = 0.0;
            iVar9 = iVar6;
            do {
              RVar17 = (*Pfilter)((fVar19 - (float)iVar9) * fVar18);
              fVar13 = fVar13 + RVar17;
              iVar9 = iVar9 + 1;
            } while (iVar2 + 1 != iVar9);
            if (iVar2 < iVar6) goto LAB_001509f1;
            local_94 = 0.0;
            uVar4 = 0xffffffff;
            fVar14 = -1e+20;
            do {
              RVar17 = (*Pfilter)((fVar19 - (float)iVar6) * fVar18);
              fVar15 = RVar17 * (1.0 / fVar13);
              if ((fVar15 != 0.0) || (NAN(fVar15))) {
                iVar9 = reflect(iVar6,src_x,boundary_op);
                uVar1 = pCVar11->n;
                pCVar11->n = uVar1 + 1;
                *(short *)((long)&pCVar11->p->pixel + (ulong)((uint)uVar1 * 8)) = (short)iVar9;
                *(float *)((long)&pCVar11->p->weight + (ulong)((uint)uVar1 * 8)) = fVar15;
                local_94 = local_94 + fVar15;
                if (fVar14 < fVar15) {
                  uVar4 = (uint)uVar1;
                  fVar14 = fVar15;
                }
              }
              iVar6 = iVar6 + 1;
            } while (iVar2 + 1 != iVar6);
            if ((uVar4 == 0xffffffff) || (pCVar11->n == 0)) goto LAB_001509f1;
            if ((local_94 != 1.0) || (NAN(local_94))) {
              pCVar11->p[uVar4].weight = (1.0 - local_94) + pCVar11->p[uVar4].weight;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != (uint)dst_x);
        }
        goto LAB_00150a08;
      }
    }
  }
  else if (0 < dst_x) {
    fVar13 = (filter_support / fVar19) * filter_scale;
    puVar10 = (undefined8 *)&pCVar3->field_0x4;
    uVar8 = 0;
    iVar6 = 0;
    do {
      fVar14 = ((float)(int)uVar8 + 0.5) / fVar19 + -0.5 + src_ofs;
      fVar15 = floorf(fVar14 - fVar13);
      fVar16 = ceilf(fVar13 + fVar14);
      *(float *)((long)puVar10 + -4) = fVar14;
      *puVar10 = CONCAT44((int)fVar16,(int)fVar15);
      iVar6 = (iVar6 - (int)fVar15) + (int)fVar16 + 1;
      uVar8 = uVar8 + 1;
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
    } while ((uint)dst_x != uVar8);
    if ((iVar6 != 0) &&
       (local_40 = (Contrib *)crnlib_calloc((long)iVar6,8,(size_t *)0x0), local_40 != (Contrib *)0x0
       )) {
      if (0 < dst_x) {
        uVar8 = 0;
        pCVar7 = local_40;
        do {
          fVar13 = *(float *)(&pCVar3->n + uVar8 * 6);
          iVar6 = *(int *)(&pCVar3->field_0x4 + uVar8 * 0xc);
          iVar2 = *(int *)((long)&pCVar3->p + uVar8 * 0xc);
          p[uVar8].n = 0;
          p[uVar8].p = pCVar7;
          if (iVar2 < iVar6) goto LAB_001509f1;
          pCVar11 = p + uVar8;
          pCVar7 = pCVar7 + ((iVar2 - iVar6) + 1);
          fVar14 = 0.0;
          iVar9 = iVar6;
          do {
            RVar17 = (*Pfilter)((fVar13 - (float)iVar9) * fVar19 * fVar18);
            fVar14 = fVar14 + RVar17;
            iVar9 = iVar9 + 1;
          } while (iVar2 + 1 != iVar9);
          if (iVar2 < iVar6) goto LAB_001509f1;
          local_68 = 0.0;
          uVar4 = 0xffffffff;
          fVar15 = -1e+20;
          do {
            RVar17 = (*Pfilter)((fVar13 - (float)iVar6) * fVar19 * fVar18);
            fVar16 = RVar17 * (1.0 / fVar14);
            if ((fVar16 != 0.0) || (NAN(fVar16))) {
              iVar9 = reflect(iVar6,src_x,boundary_op);
              uVar1 = pCVar11->n;
              pCVar11->n = uVar1 + 1;
              *(short *)((long)&pCVar11->p->pixel + (ulong)((uint)uVar1 * 8)) = (short)iVar9;
              *(float *)((long)&pCVar11->p->weight + (ulong)((uint)uVar1 * 8)) = fVar16;
              local_68 = local_68 + fVar16;
              if (fVar15 < fVar16) {
                uVar4 = (uint)uVar1;
                fVar15 = fVar16;
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar2 + 1 != iVar6);
          if ((uVar4 == 0xffffffff) || (pCVar11->n == 0)) goto LAB_001509f1;
          if ((local_68 != 1.0) || (NAN(local_68))) {
            pCVar11->p[uVar4].weight = (1.0 - local_68) + pCVar11->p[uVar4].weight;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)dst_x);
      }
      goto LAB_00150a08;
    }
  }
LAB_001509fb:
  crnlib_free(p);
  pCVar12 = (Contrib_List *)0x0;
LAB_00150a08:
  crnlib_free(pCVar5);
  return pCVar12;
LAB_001509f1:
  crnlib_free(local_40);
  goto LAB_001509fb;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
    int src_x, int dst_x, Boundary_Op boundary_op,
    Resample_Real (*Pfilter)(Resample_Real),
    Resample_Real filter_support,
    Resample_Real filter_scale,
    Resample_Real src_ofs) {
  typedef struct
  {
    // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
    Resample_Real center;
    int left, right;
  } Contrib_Bounds;

  int i, j, k, n, left, right;
  Resample_Real total_weight;
  Resample_Real xscale, center, half_width, weight;
  Contrib_List* Pcontrib;
  Contrib* Pcpool;
  Contrib* Pcpool_next;
  Contrib_Bounds* Pcontrib_bounds;

  if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == NULL)
    return NULL;

  Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
  if (!Pcontrib_bounds) {
    crnlib_free(Pcontrib);
    return (NULL);
  }

  const Resample_Real oo_filter_scale = 1.0f / filter_scale;

  const Resample_Real NUDGE = 0.5f;
  xscale = dst_x / (Resample_Real)src_x;

  if (xscale < 1.0f) {
    int total;
    (void)total;

    /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

    // stretched half width of filter
    half_width = (filter_support / xscale) * filter_scale;

    // Find the range of source sample(s) that will contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }
    total = n;

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;

      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);
      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  } else {
    /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

    half_width = filter_support * filter_scale;

    // Find the source sample(s) that contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    int total = n;
    if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;
      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);

      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);

      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  }

#if RESAMPLER_DEBUG
  printf("*******\n");
#endif

  crnlib_free(Pcontrib_bounds);

  return Pcontrib;
}